

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

string * testing::internal::DefaultParamName<int>
                   (string *__return_storage_ptr__,TestParamInfo<int> *info)

{
  std::__cxx11::to_string(__return_storage_ptr__,info->index);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  return std::to_string(info.index);
}